

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O1

void __thiscall
TCLAP::CmdLine::xorAdd(CmdLine *this,vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *ors)

{
  Arg *pAVar1;
  pointer ppAVar2;
  long *local_50 [2];
  long local_40 [2];
  
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::push_back(&(this->_xorHandler)._orList,ors);
  ppAVar2 = (ors->super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar2 !=
      (ors->super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pAVar1 = *ppAVar2;
      pAVar1->_required = true;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"OR required","");
      std::__cxx11::string::_M_assign((string *)&pAVar1->_requireLabel);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])(this,*ppAVar2);
      ppAVar2 = ppAVar2 + 1;
    } while (ppAVar2 !=
             (ors->super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

inline void CmdLine::xorAdd( const std::vector<Arg*>& ors )
{
	_xorHandler.add( ors );

	for (ArgVectorIterator it = ors.begin(); it != ors.end(); it++)
	{
		(*it)->forceRequired();
		(*it)->setRequireLabel( "OR required" );
		add( *it );
	}
}